

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> __thiscall
duckdb::BinaryDeserializer::Deserialize<duckdb::SelectStatement>(BinaryDeserializer *this)

{
  BinaryDeserializer *in_RSI;
  
  OnObjectBegin(in_RSI);
  SelectStatement::Deserialize((SelectStatement *)this,&in_RSI->super_Deserializer);
  OnObjectEnd(in_RSI);
  return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)this;
}

Assistant:

unique_ptr<T> Deserialize() {
		OnObjectBegin();
		auto result = T::Deserialize(*this);
		OnObjectEnd();
		D_ASSERT(nesting_level == 0); // make sure we are at the root level
		return result;
	}